

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix.cc
# Opt level: O1

ColMatrix * __thiscall
fizplex::ColMatrix::operator*(ColMatrix *__return_storage_ptr__,ColMatrix *this,ColMatrix *rhs)

{
  size_t sVar1;
  size_t _m;
  size_t _n;
  invalid_argument *this_00;
  size_t column;
  size_t row;
  size_t column_00;
  double dVar2;
  double dVar3;
  double local_58;
  
  sVar1 = this->n;
  if (sVar1 != rhs->m) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Wrong dimensions for matrix multiplication!");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  _m = this->m;
  _n = rhs->n;
  ColMatrix(__return_storage_ptr__,_m,_n);
  if (_m != 0) {
    row = 0;
    do {
      if (_n != 0) {
        column_00 = 0;
        do {
          if (sVar1 == 0) {
            local_58 = 0.0;
          }
          else {
            local_58 = 0.0;
            column = 0;
            do {
              dVar2 = get_value(this,row,column);
              dVar3 = get_value(rhs,column,column_00);
              local_58 = local_58 + dVar2 * dVar3;
              column = column + 1;
            } while (sVar1 != column);
          }
          if (1e-05 < ABS(local_58)) {
            SVector::add_value((__return_storage_ptr__->cols).
                               super__Vector_base<fizplex::SVector,_std::allocator<fizplex::SVector>_>
                               ._M_impl.super__Vector_impl_data._M_start + column_00,row,local_58);
          }
          column_00 = column_00 + 1;
        } while (column_00 != _n);
      }
      row = row + 1;
    } while (row != _m);
  }
  return __return_storage_ptr__;
}

Assistant:

ColMatrix ColMatrix::operator*(const ColMatrix &rhs) const {
  if (n != rhs.row_count())
    throw std::invalid_argument("Wrong dimensions for matrix multiplication!");
  const size_t row_num = m;
  const size_t col_num = rhs.col_count();
  const size_t vec_length = n;
  ColMatrix result(row_num, col_num);
  for (size_t row = 0; row < row_num; ++row) {
    for (size_t col = 0; col < col_num; ++col) {
      double val = 0.0;
      for (size_t i = 0; i < vec_length; ++i)
        val += get_value(row, i) * rhs.get_value(i, col);
      // matrix multipl is used for testing the inverse mainly
      // use looser equality check for this (1e-5)
      if (!is_zero(val, 1e-5))
        result.add_value(row, col, val);
    }
  }
  return result;
}